

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_prevote_req(raft_server *this,req_msg *req)

{
  ulong uVar1;
  _func_int **pp_Var2;
  bool bVar3;
  long lVar4;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<cornerstone::resp_msg> sVar6;
  undefined1 auVar7 [16];
  ptr<resp_msg> pVar8;
  int local_50;
  undefined4 uStack_4c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined4 local_2c;
  
  local_40 = ((req[3].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
             super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50 = 0x13;
  local_2c = *(undefined4 *)(in_RDX + 0x14);
  sVar6 = std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
                    ((unsigned_long *)this,(msg_type *)&local_40,&local_50,
                     (int *)((long)&(req->super_msg_base).term_ + 4));
  uVar1 = *(ulong *)(in_RDX + 0x20);
  pp_Var2 = req[4].super_msg_base._vptr_msg_base;
  (**(code **)(*pp_Var2 + 0x20))
            (&local_40,pp_Var2,
             sVar6.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi._M_pi);
  bVar3 = true;
  if (uVar1 <= local_40->term_) {
    lVar4 = *(long *)(in_RDX + 0x20);
    (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_50);
    if (lVar4 == *(long *)CONCAT44(uStack_4c,local_50)) {
      lVar4 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      bVar3 = lVar4 - 1U <= *(ulong *)(in_RDX + 0x28);
    }
    else {
      bVar3 = false;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                req[3].log_entries_.
                super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = (bool)(((__shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2> *)
                 &(_Var5._M_pi)->_vptr__Sp_counted_base)->_M_ptr <= *(element_type **)(in_RDX + 8) &
                bVar3);
  if (*(char *)((long)((req->log_entries_).
                       super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[7].
                       super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 1) + 1) == '\x01') {
    bVar3 = (bool)(bVar3 & req[10].last_log_idx_ != 0);
  }
  if (bVar3) {
    pp_Var2 = this->_vptr_raft_server;
    auVar7 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    _Var5._M_pi = auVar7._8_8_;
    pp_Var2[4] = auVar7._0_8_;
    *(undefined1 *)(pp_Var2 + 5) = 1;
  }
  pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar8.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_prevote_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::prevote_response, id_, req.get_src()));
    bool log_okay = req.get_last_log_term() > log_store_->last_entry()->get_term() ||
                    (req.get_last_log_term() == log_store_->last_entry()->get_term() &&
                     log_store_->next_slot() - 1 <= req.get_last_log_idx());
    bool grant = req.get_term() >= state_->get_term() && log_okay;
    if (ctx_->params_->defensive_prevote_)
    {
        // In defensive mode, server will deny the prevote when it's operating well.
        grant = grant && prevote_state_;
    }

    if (grant)
    {
        resp->accept(log_store_->next_slot());
    }

    return resp;
}